

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O0

void __thiscall
spvtools::opt::UpgradeMemoryModel::UpgradeMemoryScope::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this,Instruction *inst)

{
  UpgradeMemoryModel *this_00;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  Instruction *pIVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  uint32_t local_d4;
  iterator local_d0;
  undefined8 local_c8;
  SmallVector<unsigned_int,_2UL> local_c0;
  uint32_t local_94;
  iterator local_90;
  undefined8 local_88;
  SmallVector<unsigned_int,_2UL> local_80;
  uint32_t local_54;
  iterator local_50;
  undefined8 local_48;
  SmallVector<unsigned_int,_2UL> local_40;
  Instruction *local_18;
  Instruction *inst_local;
  anon_class_8_1_8991fb9c *this_local;
  
  this_00 = this->this;
  local_18 = inst;
  inst_local = (Instruction *)this;
  OVar3 = Instruction::opcode(inst);
  bVar2 = spvOpcodeIsAtomicOp(OVar3);
  if (bVar2) {
    uVar4 = Instruction::GetSingleWordInOperand(local_18,1);
    bVar2 = IsDeviceScope(this_00,uVar4);
    pIVar1 = local_18;
    if (bVar2) {
      local_54 = GetScopeConstant(this_00,QueueFamily);
      local_50 = &local_54;
      local_48 = 1;
      init_list_01._M_len = 1;
      init_list_01._M_array = local_50;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_40,init_list_01);
      Instruction::SetInOperand(pIVar1,1,&local_40);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_40);
    }
  }
  else {
    OVar3 = Instruction::opcode(local_18);
    if (OVar3 == OpControlBarrier) {
      uVar4 = Instruction::GetSingleWordInOperand(local_18,1);
      bVar2 = IsDeviceScope(this_00,uVar4);
      pIVar1 = local_18;
      if (bVar2) {
        local_94 = GetScopeConstant(this_00,QueueFamily);
        local_90 = &local_94;
        local_88 = 1;
        init_list_00._M_len = 1;
        init_list_00._M_array = local_90;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_80,init_list_00);
        Instruction::SetInOperand(pIVar1,1,&local_80);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_80);
      }
    }
    else {
      OVar3 = Instruction::opcode(local_18);
      if (OVar3 == OpMemoryBarrier) {
        uVar4 = Instruction::GetSingleWordInOperand(local_18,0);
        bVar2 = IsDeviceScope(this_00,uVar4);
        pIVar1 = local_18;
        if (bVar2) {
          local_d4 = GetScopeConstant(this_00,QueueFamily);
          local_d0 = &local_d4;
          local_c8 = 1;
          init_list._M_len = 1;
          init_list._M_array = local_d0;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c0,init_list);
          Instruction::SetInOperand(pIVar1,0,&local_c0);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c0);
        }
      }
    }
  }
  return;
}

Assistant:

void UpgradeMemoryModel::UpgradeMemoryScope() {
  get_module()->ForEachInst([this](Instruction* inst) {
    // Don't need to handle all the operations that take a scope.
    // * Group operations can only be subgroup
    // * Non-uniform can only be workgroup or subgroup
    // * Named barriers are not supported by Vulkan
    // * Workgroup ops (e.g. async_copy) have at most workgroup scope.
    if (spvOpcodeIsAtomicOp(inst->opcode())) {
      if (IsDeviceScope(inst->GetSingleWordInOperand(1))) {
        inst->SetInOperand(1, {GetScopeConstant(spv::Scope::QueueFamilyKHR)});
      }
    } else if (inst->opcode() == spv::Op::OpControlBarrier) {
      if (IsDeviceScope(inst->GetSingleWordInOperand(1))) {
        inst->SetInOperand(1, {GetScopeConstant(spv::Scope::QueueFamilyKHR)});
      }
    } else if (inst->opcode() == spv::Op::OpMemoryBarrier) {
      if (IsDeviceScope(inst->GetSingleWordInOperand(0))) {
        inst->SetInOperand(0, {GetScopeConstant(spv::Scope::QueueFamilyKHR)});
      }
    }
  });
}